

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

JavascriptString *
Js::JavascriptArray::JoinHelper
          (Var thisArg,JavascriptString *separator,ScriptContext *scriptContext)

{
  Type TVar1;
  ScriptContext *pSVar2;
  bool bVar3;
  BOOL BVar4;
  JavascriptArray *obj;
  JavascriptProxy *this;
  RecyclableObject *object;
  JavascriptString *pJVar5;
  JavascriptNumberObject *object_00;
  JavascriptNativeIntArray *arr;
  JavascriptNativeFloatArray *arr_00;
  ScriptContext **local_a8;
  long local_a0;
  Var *local_98;
  bool *local_90;
  ScriptContext **local_88;
  undefined1 local_80;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  Var thisArg_local;
  Var target;
  ScriptContext *local_40;
  ScriptContext *scriptContext_local;
  bool isProxy;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  jsReentLock._24_8_ = thisArg;
  target = separator;
  local_40 = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,thisArg);
  obj = TryVarToNonES5Array(thisArg);
  bVar3 = VarIs<Js::JavascriptProxy>(thisArg);
  if (bVar3) {
    this = UnsafeVarTo<Js::JavascriptProxy>(thisArg);
  }
  else {
    this = (JavascriptProxy *)0x0;
  }
  if (obj == (JavascriptArray *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = (((((obj->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
              javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr ==
            scriptContext;
  }
  if (this == (JavascriptProxy *)0x0) {
    scriptContext_local._7_1_ = false;
LAB_00a474a4:
    thisArg_local = (Var)0x0;
    BVar4 = ScriptContext::CheckObject(scriptContext,thisArg);
    if (BVar4 != 0) {
LAB_00a474b3:
      pJVar5 = JavascriptLibrary::GetEmptyString
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      goto LAB_00a475c5;
    }
LAB_00a474c2:
    ScriptContext::PushObject(scriptContext,thisArg);
  }
  else {
    pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    scriptContext_local._7_1_ = pSVar2 == scriptContext;
    thisArg_local = (Var)0x0;
    if (pSVar2 != scriptContext) goto LAB_00a474a4;
    object = JavascriptProxy::GetTarget(this);
    thisArg_local = object;
    if (object == (RecyclableObject *)0x0) goto LAB_00a474c2;
    BVar4 = ScriptContext::CheckObject(scriptContext,object);
    if (BVar4 != 0) goto LAB_00a474b3;
    ScriptContext::PushObject(scriptContext,object);
  }
  local_a8 = &local_40;
  local_88 = (ScriptContext **)&local_a8;
  local_a0 = (long)&scriptContext_local + 7;
  local_98 = &thisArg_local;
  local_90 = &jsReentLock.m_savedNoJsReentrancy;
  local_80 = 1;
  if (bVar3) {
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(thisArg);
    TVar1 = ((obj->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->typeId;
    if (TVar1 == TypeIds_ArrayLast) {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      arr_00 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(obj);
      pJVar5 = JoinArrayHelper<Js::JavascriptNativeFloatArray>
                         (arr_00,(JavascriptString *)target,local_40);
      goto LAB_00a4758c;
    }
    if (TVar1 == TypeIds_NativeIntArray) {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      arr = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>(obj);
      pJVar5 = JoinArrayHelper<Js::JavascriptNativeIntArray>
                         (arr,(JavascriptString *)target,local_40);
      goto LAB_00a4758c;
    }
    if (TVar1 == TypeIds_Array) {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pJVar5 = JoinArrayHelper<Js::JavascriptArray>(obj,(JavascriptString *)target,local_40);
      goto LAB_00a4758c;
    }
    pJVar5 = (JavascriptString *)0x0;
  }
  else {
    bVar3 = VarIs<Js::RecyclableObject>(thisArg);
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if (bVar3) {
      object_00 = (JavascriptNumberObject *)VarTo<Js::RecyclableObject>((Var)jsReentLock._24_8_);
    }
    else {
      object_00 = JavascriptLibrary::CreateNumberObject
                            ((local_40->super_ScriptContextBase).javascriptLibrary,
                             (Var)jsReentLock._24_8_);
    }
    pJVar5 = JoinOtherHelper((RecyclableObject *)object_00,(JavascriptString *)target,local_40);
LAB_00a4758c:
    JsReentLock::MutateArrayObject((JsReentLock *)local_78);
    *(bool *)((long)local_78 + 0x108) = true;
  }
  local_80 = 0;
  anon_func::FinallyObject::~FinallyObject((FinallyObject *)&local_88);
  if (pJVar5 == (JavascriptString *)0x0) {
    pJVar5 = JavascriptLibrary::GetEmptyString
                       ((local_40->super_ScriptContextBase).javascriptLibrary);
  }
LAB_00a475c5:
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pJVar5;
}

Assistant:

JavascriptString* JavascriptArray::JoinHelper(Var thisArg, JavascriptString* separator, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, thisArg);

        JavascriptArray * arr = JavascriptArray::TryVarToNonES5Array(thisArg);
        JavascriptProxy * proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(thisArg);
        bool isArray = arr && (scriptContext == arr->GetScriptContext());
        bool isProxy = proxy && (scriptContext == proxy->GetScriptContext());
        Var target = NULL;
        bool isTargetObjectPushed = false;
        // if we are visiting a proxy object, track that we have visited the target object as well so the next time w
        // call the join helper for the target of this proxy, we will return above.
        if (isProxy)
        {
            Assert(proxy);
            target = proxy->GetTarget();
            if (target != nullptr)
            {
                // If we end up joining same array, instead of going in infinite loop, return the empty string
                if (scriptContext->CheckObject(target))
                {
                    return scriptContext->GetLibrary()->GetEmptyString();
                }
                else
                {
                    scriptContext->PushObject(target);
                    isTargetObjectPushed = true;
                }
            }
        }
        // If we end up joining same array, instead of going in infinite loop, return the empty string
        else if (scriptContext->CheckObject(thisArg))
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        if (!isTargetObjectPushed)
        {
            scriptContext->PushObject(thisArg);
        }

        JavascriptString* res = nullptr;

        TryFinally([&]()
        {
            if (isArray)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray(thisArg);
#endif
                switch (arr->GetTypeId())
                {
                case Js::TypeIds_Array:
                    JS_REENTRANT(jsReentLock, res = JoinArrayHelper(arr, separator, scriptContext));
                    break;
                case Js::TypeIds_NativeIntArray:
                    JS_REENTRANT(jsReentLock, res = JoinArrayHelper(UnsafeVarTo<JavascriptNativeIntArray>(arr), separator, scriptContext));
                    break;
                case Js::TypeIds_NativeFloatArray:
                    JS_REENTRANT(jsReentLock, res = JoinArrayHelper(UnsafeVarTo<JavascriptNativeFloatArray>(arr), separator, scriptContext));
                    break;
                }

            }
            else if (VarIs<RecyclableObject>(thisArg))
            {
                JS_REENTRANT(jsReentLock, res = JoinOtherHelper(VarTo<RecyclableObject>(thisArg), separator, scriptContext));
            }
            else
            {
                JS_REENTRANT(jsReentLock, res = JoinOtherHelper(scriptContext->GetLibrary()->CreateNumberObject(thisArg), separator, scriptContext));
            }
        },
        [&](bool/*hasException*/)
        {
            Var top = scriptContext->PopObject();
            if (isProxy)
            {
                AssertMsg(top == target, "Unmatched operation stack");
            }
            else
            {
                AssertMsg(top == thisArg, "Unmatched operation stack");
            }
        });

        if (res == nullptr)
        {
            res = scriptContext->GetLibrary()->GetEmptyString();
        }

        return res;
    }